

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void voc_parse_dict_lookup(voccxdef *ctx)

{
  objnum *list2;
  char cVar1;
  ushort uVar2;
  runcxdef *ctx_00;
  runsdef *prVar3;
  bool bVar4;
  ushort *puVar5;
  uint uVar6;
  ushort **ppuVar7;
  vocwdef *pvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ushort *wrd2;
  int len2;
  int iVar12;
  objnum *list1;
  uint typsiz;
  uint wrdsiz;
  uchar *wrdp;
  uchar *typp;
  vocseadef search_ctx;
  uint local_a4;
  int local_a0;
  uint local_9c;
  ulong local_98;
  ushort *local_90;
  objnum *local_88;
  voccxdef *local_80;
  ulong local_78;
  ushort *local_70;
  ulong local_68;
  vocseadef local_60;
  
  list1 = (objnum *)ctx->voc_stk_cur;
  list2 = list1 + 200;
  if (list2 <= ctx->voc_stk_end) {
    ctx_00 = ctx->voccxrun;
    ctx->voc_stk_cur = (uchar *)list2;
    if (list1 + 400 <= ctx->voc_stk_end) {
      ctx->voc_stk_cur = (uchar *)(list1 + 400);
      prVar3 = ctx_00->runcxsp;
      ctx_00->runcxsp = prVar3 + -1;
      if (prVar3[-1].runstyp == '\a') {
        local_9c = *(ushort *)prVar3[-1].runsv.runsvstr - 2;
        local_90 = (ushort *)((long)prVar3[-1].runsv.runsvstr + 2);
        ctx_00->runcxsp = prVar3 + -2;
        if (prVar3[-2].runstyp == '\a') {
          local_a4 = *(ushort *)prVar3[-2].runsv.runsvstr - 2;
          local_70 = (ushort *)((long)prVar3[-2].runsv.runsvstr + 2);
          local_98 = 0;
          local_88 = list1;
          local_80 = ctx;
          do {
            puVar5 = local_90;
            if (local_9c == 0) break;
            if ((char)*local_90 == '\x03') {
              uVar2 = *(ushort *)((long)local_90 + 1);
              local_78 = 0;
              local_a0 = uVar2 - 2;
              if (local_a0 == 0) {
                wrd2 = (ushort *)0x0;
                len2 = 0;
              }
              else {
                wrd2 = local_90 + 2;
                iVar12 = 0;
                local_68 = (ulong)uVar2;
                do {
                  cVar1 = *(char *)((long)wrd2 + -1);
                  if ((-1 < (long)cVar1) &&
                     (ppuVar7 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) != 0)) {
                    len2 = ((int)local_68 - iVar12) + -3;
                    list1 = local_88;
                    ctx = local_80;
                    local_a0 = iVar12;
                    goto LAB_001f8567;
                  }
                  iVar12 = iVar12 + 1;
                  wrd2 = (ushort *)((long)wrd2 + 1);
                } while (uVar2 - 2 != iVar12);
                wrd2 = (ushort *)0x0;
                len2 = 0;
                list1 = local_88;
                ctx = local_80;
              }
LAB_001f8567:
              if ((local_a4 != 0) && ((char)*local_70 == '\x01')) {
                lVar9 = 0;
                do {
                  if ((voc_parse_dict_lookup::typemap[lVar9].flag & *(uint *)((long)local_70 + 1))
                      != 0) {
                    local_78 = (ulong)(uint)voc_parse_dict_lookup::typemap[lVar9].prop;
                    break;
                  }
                  lVar9 = lVar9 + 1;
                } while ((int)lVar9 != 6);
              }
              pvVar8 = vocffw(ctx,(char *)((long)puVar5 + 3),local_a0,(char *)wrd2,len2,
                              (int)local_78,&local_60);
              if (pvVar8 == (vocwdef *)0x0) {
                uVar10 = 0;
              }
              else {
                uVar6 = 0;
                uVar10 = 0;
                do {
                  if ((int)uVar6 < 199) {
                    if ((int)uVar6 < 1) {
                      uVar11 = 0;
                    }
                    else {
                      uVar10 = 0;
                      do {
                        uVar11 = uVar10;
                        if (list2[uVar10] == pvVar8->vocwobj) break;
                        uVar10 = uVar10 + 1;
                        uVar11 = (ulong)uVar6;
                      } while (uVar6 != uVar10);
                    }
                    uVar10 = (ulong)uVar6;
                    if ((uint)uVar11 == uVar6) {
                      uVar10 = (ulong)(uVar6 + 1);
                      list2[(int)uVar6] = pvVar8->vocwobj;
                    }
                  }
                  if (0xc6 < (int)uVar6) break;
                  pvVar8 = vocfnw(ctx,&local_60);
                  uVar6 = (uint)uVar10;
                } while (pvVar8 != (vocwdef *)0x0);
              }
              list2[(int)uVar10] = 0xffff;
              if ((int)local_98 == 0) {
                memcpy(list1,list2,(long)(int)uVar10 * 2 + 2);
              }
              else {
                uVar6 = vocisect(list1,list2);
                uVar10 = (ulong)uVar6;
              }
              local_98 = uVar10;
              if ((int)uVar10 != 0) goto LAB_001f8665;
              local_98 = 0;
              bVar4 = false;
            }
            else {
LAB_001f8665:
              lstadv((uchar **)&local_90,&local_9c);
              bVar4 = true;
              if (local_a4 != 0) {
                lstadv((uchar **)&local_70,&local_a4);
              }
            }
          } while (bVar4);
          voc_push_objlist(ctx,list1,(int)local_98);
          ctx->voc_stk_cur = (uchar *)list1;
          return;
        }
      }
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3fc);
    }
  }
  errsigf(ctx->voccxerr,"TADS",0x417);
}

Assistant:

void voc_parse_dict_lookup(voccxdef *ctx)
{
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    uchar *wrdp;
    uint wrdsiz;
    uchar *typp;
    uint typsiz;
    objnum *list1;
    objnum *list2;
    int cnt1;
    int cnt2;

    /* enter our stack frame and allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, objnum, list1);
    VOC_MAX_ARRAY(ctx, objnum, list2);
    
    /* get the word list, and read and skip its size prefix */
    wrdp = runpoplst(rcx);
    wrdsiz = osrp2(wrdp) - 2;
    wrdp += 2;

    /* get the type list, and read and skip its size prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* nothing in the main list yet */
    cnt1 = 0;

    /* go through the word list */
    while (wrdsiz > 0)
    {
        int curtyp;
        int type_prop;
        char *curword;
        uint curwordlen;
        char *curword2;
        uint curwordlen2;
        vocwdef *v;
        char *p;
        uint len;
        vocseadef  search_ctx;
        
        /* if this entry is a string, consider it */
        if (*wrdp == DAT_SSTRING)
        {
            /* get the current word's text string */
            curword = (char *)(wrdp + 3);
            curwordlen = osrp2(wrdp+1) - 2;

            /* check for an embedded space */
            for (p = curword, len = curwordlen ; len != 0 && !t_isspace(*p) ;
                 ++p, --len) ;
            if (len != 0)
            {
                /* get the second word */
                curword2 = p + 1;
                curwordlen2 = len - 1;

                /* truncate the first word accordingly */
                curwordlen -= len;
            }
            else
            {
                /* no embedded space -> no second word */
                curword2 = 0;
                curwordlen2 = 0;
            }

            /* presume we won't find a valid type property */
            type_prop = PRP_INVALID;

            /* 
             *   get this type entry, if there's another entry in the
             *   list, and it's of the appropriate type 
             */
            if (typsiz > 0 && *typp == DAT_NUMBER)
            {
                /*
                 *   Figure out what type property we'll be using.  We'll
                 *   consider only one meaning for each word, and we'll
                 *   arbitrarily pick one if the type code has more than
                 *   one type, because we expect the caller to provide
                 *   exactly one type per word.  
                 */
                int i;
                struct typemap_t
                {
                    int flag;
                    int prop;
                };
                static struct typemap_t typemap[] =
                {
                    { VOCT_ARTICLE, PRP_ARTICLE },
                    { VOCT_ADJ,     PRP_ADJ },
                    { VOCT_NOUN,    PRP_NOUN },
                    { VOCT_PREP,    PRP_PREP },
                    { VOCT_VERB,    PRP_VERB },
                    { VOCT_PLURAL,  PRP_PLURAL }
                };
                struct typemap_t *mapp;

                /* get the type */
                curtyp = (int)osrp4(typp+1);

                /* search for a type */
                for (mapp = typemap, i = sizeof(typemap)/sizeof(typemap[0]) ;
                     i != 0 ; ++mapp, --i)
                {
                    /* if this flag is set, use this type property */
                    if ((curtyp & mapp->flag) != 0)
                    {
                        /* use this one */
                        type_prop = mapp->prop;
                        break;
                    }
                }
            }

            /* nothing in the new list yet */
            cnt2 = 0;

            /* scan for matching words */
            for (v = vocffw(ctx, curword, curwordlen, curword2, curwordlen2,
                            type_prop, &search_ctx) ;
                 v != 0 ;
                 v = vocfnw(ctx, &search_ctx))
            {
                int i;
                
                /* make sure we have room in our list */
                if (cnt2 >= VOCMAXAMBIG - 1)
                    break;

                /* make sure that this entry isn't already in our list */
                for (i = 0 ; i < cnt2 ; ++i)
                {
                    /* if this entry matches, stop looking */
                    if (list2[i] == v->vocwobj)
                        break;
                }

                /* if it's not already in the list, add it now */
                if (i == cnt2)
                {
                    /* add it to our list */
                    list2[cnt2++] = v->vocwobj;
                }
            }

            /* terminate the list */
            list2[cnt2] = MCMONINV;

            /* 
             *   if there's nothing in the first list, simply copy this
             *   into the first list; otherwise, intersect the two lists 
             */
            if (cnt1 == 0)
            {
                /* this is the first list -> copy it into the main list */
                memcpy(list1, list2, (cnt2+1)*sizeof(list2[0]));
                cnt1 = cnt2;
            }
            else
            {
                /* intersect the two lists */
                cnt1 = vocisect(list1, list2);
            }

            /* 
             *   if there's nothing in the result list now, there's no
             *   need to look any further, because further intersection
             *   will yield nothing 
             */
            if (cnt1 == 0)
                break;
        }
        
        /* advance the word list */
        lstadv(&wrdp, &wrdsiz);

        /* if there's anything left in the type list, advance it as well */
        if (typsiz > 0)
            lstadv(&typp, &typsiz);
    }

    /* push the result list */
    voc_push_objlist(ctx, list1, cnt1);

    /* exit our stack frame */
    voc_leave(ctx, save_sp);
}